

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O1

void Cnf_ManPostprocess(Cnf_Man_t *p)

{
  char cVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  Cnf_Cut_t *pCut;
  Cnf_Cut_t *pCutFan;
  bool bVar5;
  Cnf_Cut_t *pCutRes;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  int Order [16];
  int Costs [16];
  int aiStack_b8 [16];
  int aiStack_78 [18];
  
  pVVar6 = p->pManAig->vObjs;
  uVar7 = (ulong)(uint)pVVar6->nSize;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      ppvVar3 = pVVar6->pArray;
      pvVar4 = ppvVar3[lVar12];
      if (((pvVar4 != (void *)0x0) && ((*(ulong *)((long)pvVar4 + 0x18) & 0xffffffc0) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7)) {
        pCut = *(Cnf_Cut_t **)((long)pvVar4 + 0x28);
        cVar1 = pCut->nFanins;
        if ('\0' < cVar1) {
          uVar9 = 0;
          do {
            if (pVVar6 == (Vec_Ptr_t *)0x0) {
              pvVar10 = (void *)0x0;
            }
            else {
              uVar2 = *(uint *)((long)pCut[1].vIsop + uVar9 * 4 + -8);
              if (((int)uVar2 < 0) || ((int)uVar7 <= (int)uVar2)) goto LAB_0055b3cf;
              pvVar10 = ppvVar3[uVar2];
            }
            if (pvVar10 == (void *)0x0) break;
            aiStack_b8[uVar9] = (int)uVar9;
            iVar11 = 0;
            if (0xfffffffd < (*(uint *)((long)pvVar10 + 0x18) & 7) - 7) {
              iVar11 = (int)*(char *)(*(long *)((long)pvVar10 + 0x28) + 1);
            }
            aiStack_78[uVar9] = iVar11;
            uVar9 = uVar9 + 1;
          } while ((uint)(int)cVar1 != uVar9);
        }
        if ('\x01' < cVar1) {
          do {
            uVar7 = 0;
            bVar5 = false;
            do {
              iVar11 = aiStack_b8[uVar7];
              if (aiStack_78[aiStack_b8[uVar7 + 1]] < aiStack_78[iVar11]) {
                aiStack_b8[uVar7] = aiStack_b8[uVar7 + 1];
                aiStack_b8[uVar7 + 1] = iVar11;
                bVar5 = true;
              }
              uVar7 = uVar7 + 1;
            } while ((int)cVar1 - 1 != uVar7);
          } while ((bVar5) && ('\x01' < cVar1));
        }
        if ('\0' < pCut->nFanins) {
          lVar8 = 0;
          do {
            pVVar6 = p->pManAig->vObjs;
            if (pVVar6 == (Vec_Ptr_t *)0x0) {
              pvVar10 = (void *)0x0;
            }
            else {
              uVar2 = *(uint *)((long)pCut[1].vIsop + (long)aiStack_b8[lVar8] * 4 + -8);
              if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) {
LAB_0055b3cf:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar10 = pVVar6->pArray[uVar2];
            }
            if (pvVar10 == (void *)0x0) break;
            uVar2 = *(uint *)((long)pvVar10 + 0x18);
            if (0xfffffffd < (uVar2 & 7) - 7) {
              if (uVar2 < 0x40) {
                __assert_fail("pFan->nRefs != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                              ,0xcc,"void Cnf_ManPostprocess(Cnf_Man_t *)");
              }
              if ((uVar2 & 0xffffffc0) == 0x40) {
                pCutFan = *(Cnf_Cut_t **)((long)pvVar10 + 0x28);
                pCutRes = Cnf_CutCompose(p,pCut,pCutFan,*(int *)((long)pvVar10 + 0x24));
                if (pCutRes != (Cnf_Cut_t *)0x0) {
                  if ((pCutRes->Cost != 0x7f) &&
                     ((int)pCutRes->Cost <= (int)pCutFan->Cost + (int)pCut->Cost)) {
                    *(Cnf_Cut_t **)((long)pvVar4 + 0x28) = pCutRes;
                    *(undefined8 *)((long)pvVar10 + 0x28) = 0;
                    Cnf_CutUpdateRefs(p,pCut,pCutFan,pCutRes);
                    if ((*(uint *)((long)pvVar10 + 0x18) & 0xffffffc0) != 0) {
                      __assert_fail("pFan->nRefs == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                                    ,0xe0,"void Cnf_ManPostprocess(Cnf_Man_t *)");
                    }
                    Cnf_CutFree(pCut);
                    Cnf_CutFree(pCutFan);
                    break;
                  }
                  Cnf_CutFree(pCutRes);
                }
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pCut->nFanins);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar6 = p->pManAig->vObjs;
      uVar7 = (ulong)pVVar6->nSize;
    } while (lVar12 < (long)uVar7);
  }
  return;
}

Assistant:

void Cnf_ManPostprocess( Cnf_Man_t * p )
{
    Cnf_Cut_t * pCut, * pCutFan, * pCutRes;
    Aig_Obj_t * pObj, * pFan;
    int Order[16], Costs[16];
    int i, k, fChanges;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        if ( pObj->nRefs == 0 )
            continue;
        pCut = Cnf_ObjBestCut(pObj);

        // sort fanins according to their size
        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        {
            Order[k] = k;
            Costs[k] = Aig_ObjIsNode(pFan)? Cnf_ObjBestCut(pFan)->Cost : 0;
        }
        // sort the cuts by Weight
        do {
            int Temp;
            fChanges = 0;
            for ( k = 0; k < pCut->nFanins - 1; k++ )
            {
                if ( Costs[Order[k]] <= Costs[Order[k+1]] )
                    continue;
                Temp = Order[k];
                Order[k] = Order[k+1];
                Order[k+1] = Temp;
                fChanges = 1;
            }
        } while ( fChanges );


//        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        for ( k = 0; (k < (int)(pCut)->nFanins) && ((pFan) = Aig_ManObj(p->pManAig, (pCut)->pFanins[Order[k]])); k++ )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
            pCutFan = Cnf_ObjBestCut(pFan);
            // try composing these two cuts
//            Cnf_CutPrint( pCut );
            pCutRes = Cnf_CutCompose( p, pCut, pCutFan, pFan->Id );
//            Cnf_CutPrint( pCut );
//            printf( "\n" );
            // check if the cost if reduced
            if ( pCutRes == NULL || pCutRes->Cost == 127 || pCutRes->Cost > pCut->Cost + pCutFan->Cost )
            {
                if ( pCutRes )
                    Cnf_CutFree( pCutRes );
                continue;
            }
            // update the cut
            Cnf_ObjSetBestCut( pObj, pCutRes );
            Cnf_ObjSetBestCut( pFan, NULL );
            Cnf_CutUpdateRefs( p, pCut, pCutFan, pCutRes );
            assert( pFan->nRefs == 0 );
            Cnf_CutFree( pCut );
            Cnf_CutFree( pCutFan );
            break;
        }
    }
}